

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

Slice leveldb::GetLengthPrefixedSlice(char *data)

{
  char *d;
  char *in_RDI;
  char *p;
  uint32_t len;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  Slice local_10;
  
  d = GetVarint32Ptr(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (uint32_t *)in_RDI);
  Slice::Slice(&local_10,d,(ulong)in_stack_ffffffffffffffe4);
  return local_10;
}

Assistant:

static Slice GetLengthPrefixedSlice(const char* data) {
  uint32_t len;
  const char* p = data;
  p = GetVarint32Ptr(p, p + 5, &len);  // +5: we assume "p" is not corrupted
  return Slice(p, len);
}